

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::cancelChain(QFutureInterfaceBase *this,CancelMode mode)

{
  QFutureInterfaceBasePrivate *this_00;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> local_50;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = &this->d->continuationMutex;
  QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
  local_40[8] = true;
  this_00 = this->d->nonConcludedParent;
  while (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    QFutureInterfaceBasePrivate::cancelImpl(this_00,mode,(CancelOptions)0x0);
    local_50.m_mutex = &this_00->continuationMutex;
    local_50.m_isLocked = false;
    local_50._9_7_ = 0xaaaaaaaaaaaaaa;
    QBasicMutex::lock(local_50.m_mutex);
    local_50.m_isLocked = true;
    this_00 = this_00->nonConcludedParent;
    QMutexLocker<QBasicMutex>::~QMutexLocker(&local_50);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_40);
  QFutureInterfaceBasePrivate::cancelImpl(this->d,mode,(CancelOptions)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::cancelChain(QFutureInterfaceBase::CancelMode mode)
{
    // go up through the list of continuations, cancelling each of them
    {
        QMutexLocker locker(&d->continuationMutex);
        QFutureInterfaceBasePrivate *prev = d->nonConcludedParent;
        while (prev) {
            // Do not cancel continuations, because we're going bottom-to-top
            prev->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::None);
            QMutexLocker prevLocker(&prev->continuationMutex);
            prev = prev->nonConcludedParent;
        }
    }
    // finally, cancel self and all next continuations
    d->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::CancelContinuations);
}